

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIvy.c
# Opt level: O0

Ivy_Obj_t * Abc_NodeStrashAigSopAig(Ivy_Man_t *pMan,Abc_Obj_t *pNode,char *pSop)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Ivy_Obj_t *pIVar4;
  Abc_Obj_t *pAVar5;
  int fExor;
  int nFanins;
  int i;
  char *pCube;
  Ivy_Obj_t *pSum;
  Ivy_Obj_t *pAnd;
  Abc_Obj_t *pFanin;
  char *pSop_local;
  Abc_Obj_t *pNode_local;
  Ivy_Man_t *pMan_local;
  
  iVar1 = Abc_SopIsExorType(pSop);
  iVar2 = Abc_ObjFaninNum(pNode);
  iVar3 = Abc_SopGetVarNum(pSop);
  if (iVar2 == iVar3) {
    pIVar4 = Ivy_ManConst1(pMan);
    pCube = (char *)Ivy_Not(pIVar4);
    for (_nFanins = pSop; *_nFanins != '\0'; _nFanins = _nFanins + (iVar2 + 3)) {
      pSum = Ivy_ManConst1(pMan);
      for (fExor = 0; iVar3 = Abc_ObjFaninNum(pNode), fExor < iVar3; fExor = fExor + 1) {
        pAVar5 = Abc_ObjFanin(pNode,fExor);
        if (_nFanins[fExor] == '1') {
          pSum = Ivy_And(pMan,pSum,(Ivy_Obj_t *)(pAVar5->field_6).pCopy);
        }
        else if (_nFanins[fExor] == '0') {
          pIVar4 = Ivy_Not((Ivy_Obj_t *)(pAVar5->field_6).pCopy);
          pSum = Ivy_And(pMan,pSum,pIVar4);
        }
      }
      if (iVar1 == 0) {
        pCube = (char *)Ivy_Or(pMan,(Ivy_Obj_t *)pCube,pSum);
      }
      else {
        pCube = (char *)Ivy_Exor(pMan,(Ivy_Obj_t *)pCube,pSum);
      }
    }
    iVar1 = Abc_SopIsComplement(pSop);
    if (iVar1 != 0) {
      pCube = (char *)Ivy_Not((Ivy_Obj_t *)pCube);
    }
    return (Ivy_Obj_t *)pCube;
  }
  __assert_fail("nFanins == Abc_SopGetVarNum(pSop)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcIvy.c"
                ,0x3fc,"Ivy_Obj_t *Abc_NodeStrashAigSopAig(Ivy_Man_t *, Abc_Obj_t *, char *)");
}

Assistant:

Ivy_Obj_t * Abc_NodeStrashAigSopAig( Ivy_Man_t * pMan, Abc_Obj_t * pNode, char * pSop )
{
    Abc_Obj_t * pFanin;
    Ivy_Obj_t * pAnd, * pSum;
    char * pCube;
    int i, nFanins;
    int fExor = Abc_SopIsExorType(pSop);

    // get the number of node's fanins
    nFanins = Abc_ObjFaninNum( pNode );
    assert( nFanins == Abc_SopGetVarNum(pSop) );
    // go through the cubes of the node's SOP
    pSum = Ivy_Not( Ivy_ManConst1(pMan) );
    Abc_SopForEachCube( pSop, nFanins, pCube )
    {
        // create the AND of literals
        pAnd = Ivy_ManConst1(pMan);
        Abc_ObjForEachFanin( pNode, pFanin, i ) // pFanin can be a net
        {
            if ( pCube[i] == '1' )
                pAnd = Ivy_And( pMan, pAnd, (Ivy_Obj_t *)pFanin->pCopy );
            else if ( pCube[i] == '0' )
                pAnd = Ivy_And( pMan, pAnd, Ivy_Not((Ivy_Obj_t *)pFanin->pCopy) );
        }
        // add to the sum of cubes
        if ( fExor )
            pSum = Ivy_Exor( pMan, pSum, pAnd );
        else
            pSum = Ivy_Or( pMan, pSum, pAnd );
    }
    // decide whether to complement the result
    if ( Abc_SopIsComplement(pSop) )
        pSum = Ivy_Not(pSum);
    return pSum;
}